

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAtomic.h
# Opt level: O0

deInt32 deAtomicDecrementInt32(deInt32 *dstAddr)

{
  int iVar1;
  deInt32 *dstAddr_local;
  
  LOCK();
  iVar1 = *dstAddr;
  *dstAddr = *dstAddr + -1;
  UNLOCK();
  return iVar1 + -1;
}

Assistant:

DE_INLINE deInt32 deAtomicDecrementInt32 (volatile deInt32* dstAddr)
{
#if (DE_COMPILER == DE_COMPILER_MSC)
	return _InterlockedDecrement((volatile long*)dstAddr);
#elif (DE_COMPILER == DE_COMPILER_GCC) || (DE_COMPILER == DE_COMPILER_CLANG)
	return __sync_sub_and_fetch(dstAddr, 1);
#else
#	error "Implement deAtomicDecrementInt32()"
#endif
}